

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rexo.h
# Opt level: O0

rx_status rx_test_case_run(rx_summary *summary,rx_test_case *test_case)

{
  rx_status rVar1;
  int iVar2;
  ulong local_110;
  uint64_t time_end;
  uint64_t time_begin;
  void *data;
  rx_context context;
  rx_status status;
  rx_test_case *test_case_local;
  rx_summary *summary_local;
  
  if (summary == (rx_summary *)0x0) {
    __assert_fail("summary != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                  ,0x1971,
                  "enum rx_status rx_test_case_run(struct rx_summary *, const struct rx_test_case *)"
                 );
  }
  if (test_case == (rx_test_case *)0x0) {
    __assert_fail("test_case != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                  ,0x1972,
                  "enum rx_status rx_test_case_run(struct rx_summary *, const struct rx_test_case *)"
                 );
  }
  if (test_case->suite_name == (char *)0x0) {
    __assert_fail("test_case->suite_name != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                  ,0x1973,
                  "enum rx_status rx_test_case_run(struct rx_summary *, const struct rx_test_case *)"
                 );
  }
  if (test_case->name != (char *)0x0) {
    if (test_case->run == (rx_run_fn)0x0) {
      __assert_fail("test_case->run != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                    ,0x1975,
                    "enum rx_status rx_test_case_run(struct rx_summary *, const struct rx_test_case *)"
                   );
    }
    if ((test_case->config).skip == 0) {
      context.summary._4_4_ = RX_SUCCESS;
      context.env[0].__saved_mask.__val[0xf] = (unsigned_long)summary;
      if ((test_case->config).fixture.size == 0) {
        time_begin = 0;
      }
      else {
        time_begin = (uint64_t)malloc((test_case->config).fixture.size);
        if ((void *)time_begin == (void *)0x0) {
          summary->error = "failed to allocate the data";
          rx__log(RX_LOG_LEVEL_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                  ,0x1986,"failed to allocate the data(suite: \"%s\", case: \"%s\")\n",
                  test_case->suite_name,test_case->name);
          return RX_ERROR_ALLOCATION;
        }
      }
      if (((test_case->config).fixture.config.set_up == (rx_set_up_fn)0x0) ||
         (context.summary._4_4_ =
               (*(test_case->config).fixture.config.set_up)((rx_context *)&data,(void *)time_begin),
         context.summary._4_4_ == RX_SUCCESS)) {
        rVar1 = rx__get_real_time(&time_end);
        if (rVar1 != RX_SUCCESS) {
          time_end = 0xffffffffffffffff;
        }
        iVar2 = _setjmp((__jmp_buf_tag *)&data);
        if (iVar2 == 0) {
          (*test_case->run)((rx_context *)&data,(void *)time_begin);
        }
        if ((time_end == 0xffffffffffffffff) ||
           (rVar1 = rx__get_real_time(&local_110), rVar1 != RX_SUCCESS)) {
          rx__log(RX_LOG_LEVEL_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                  ,0x19a6,"failed to measure the time elapsed (suite: \"%s\", case: \"%s\")\n",
                  test_case->suite_name,test_case->name);
          summary->elapsed = 0;
        }
        else {
          if (local_110 < time_end) {
            __assert_fail("time_end >= time_begin",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                          ,0x19a9,
                          "enum rx_status rx_test_case_run(struct rx_summary *, const struct rx_test_case *)"
                         );
          }
          summary->elapsed = local_110 - time_end;
        }
        if ((test_case->config).fixture.config.tear_down != (rx_tear_down_fn)0x0) {
          (*(test_case->config).fixture.config.tear_down)((rx_context *)&data,(void *)time_begin);
        }
      }
      else {
        summary->error = "failed to set-up the fixture";
        rx__log(RX_LOG_LEVEL_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                ,0x1994,"failed to set-up the fixture (suite: \"%s\", case: \"%s\")\n",
                test_case->suite_name,test_case->name);
      }
      free((void *)time_begin);
      summary_local._4_4_ = context.summary._4_4_;
    }
    else {
      summary->skipped = 1;
      summary_local._4_4_ = RX_SUCCESS;
    }
    return summary_local._4_4_;
  }
  __assert_fail("test_case->name != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                ,0x1974,
                "enum rx_status rx_test_case_run(struct rx_summary *, const struct rx_test_case *)")
  ;
}

Assistant:

RX__MAYBE_UNUSED RX__STORAGE enum rx_status
rx_test_case_run(struct rx_summary *summary,
                 const struct rx_test_case *test_case)
{
    enum rx_status status;
    struct rx_context context;
    void *data;
    uint64_t time_begin;
    uint64_t time_end;

    RX_ASSERT(summary != NULL);
    RX_ASSERT(test_case != NULL);
    RX_ASSERT(test_case->suite_name != NULL);
    RX_ASSERT(test_case->name != NULL);
    RX_ASSERT(test_case->run != NULL);

    if (test_case->config.skip) {
        summary->skipped = 1;
        return RX_SUCCESS;
    }

    status = RX_SUCCESS;
    context.summary = summary;

    if (test_case->config.fixture.size > 0) {
        data = RX_MALLOC(test_case->config.fixture.size);
        if (data == NULL) {
            summary->error = "failed to allocate the data\0";
            RX__LOG_ERROR_2("failed to allocate the data"
                            "(suite: \"%s\", case: \"%s\")\n",
                            test_case->suite_name,
                            test_case->name);
            return RX_ERROR_ALLOCATION;
        }
    } else {
        data = NULL;
    }

    if (test_case->config.fixture.config.set_up != NULL) {
        status = test_case->config.fixture.config.set_up(&context, data);
        if (status != RX_SUCCESS) {
            summary->error = "failed to set-up the fixture\0";
            RX__LOG_ERROR_2("failed to set-up the fixture "
                            "(suite: \"%s\", case: \"%s\")\n",
                            test_case->suite_name,
                            test_case->name);
            goto data_cleanup;
        }
    }

    if (rx__get_real_time(&time_begin) != RX_SUCCESS) {
        time_begin = (uint64_t)-1;
    }

    if (setjmp(context.env) == 0) {
        test_case->run(&context, data);
    }

    if (time_begin == (uint64_t)-1
        || rx__get_real_time(&time_end) != RX_SUCCESS) {
        RX__LOG_ERROR_2("failed to measure the time elapsed "
                        "(suite: \"%s\", case: \"%s\")\n",
                        test_case->suite_name,
                        test_case->name);
        summary->elapsed = 0;
    } else {
        RX_ASSERT(time_end >= time_begin);
        summary->elapsed = (rx_uint64)(time_end - time_begin);
    }

    if (test_case->config.fixture.config.tear_down != NULL) {
        test_case->config.fixture.config.tear_down(&context, data);
    }

data_cleanup:
    RX_FREE(data);
    return status;
}